

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *Globals,stringstream *ReturnHandlerSS,String *Prologue)

{
  anon_class_32_4_300735a9 ArgHandler;
  anon_class_40_5_823809f3 ArgHandler_00;
  undefined *puVar1;
  bool bVar2;
  pointer pHVar3;
  pointer ppVar4;
  undefined8 uVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0 [32];
  ConversionStream *local_7a0;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  **ppvStack_798;
  int *local_790;
  stringstream *psStack_788;
  ConversionStream *local_780;
  byte *pbStack_778;
  stringstream *local_770;
  long lStack_768;
  stringstream *local_760;
  byte local_751;
  reference pSStack_750;
  bool IsPatch;
  ShaderParameterInfo *TopLevelParam;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *__range1;
  int outLocation;
  int inLocation;
  stringstream InterfaceVarsOutSS;
  stringstream local_5a0 [8];
  stringstream InterfaceVarsInSS;
  stringstream local_418 [8];
  stringstream PrologueSS;
  ostream local_408 [376];
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_290;
  HashMapStringKey local_288;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_278;
  iterator TopologyIt;
  string _msg;
  HashMapStringKey local_248;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_238;
  iterator PartitioningIt;
  HashMapStringKey local_228;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_218;
  iterator DomainIt;
  stringstream GlobalsSS;
  ostream local_200 [392];
  undefined1 local_78 [8];
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Attributes;
  iterator Token;
  String *Prologue_local;
  stringstream *ReturnHandlerSS_local;
  String *Globals_local;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *Params_local;
  iterator *TypeToken_local;
  ConversionStream *this_local;
  
  Attributes._M_h._M_single_bucket = (__node_base_ptr)TypeToken->_M_node;
  std::
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_78);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(TypeToken);
  ParseAttributesInComment
            (&pHVar3->Delimiter,
             (unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_78);
  ProcessShaderAttributes
            (this,(iterator *)&Attributes._M_h._M_single_bucket,
             (unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_78);
  std::__cxx11::stringstream::stringstream((stringstream *)&DomainIt);
  HashMapStringKey::HashMapStringKey(&local_228,"domain",false);
  local_218._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_78,&local_228);
  HashMapStringKey::~HashMapStringKey(&local_228);
  PartitioningIt =
       std::
       unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_78);
  bVar2 = std::__detail::operator==
                    (&local_218,
                     &PartitioningIt.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    );
  if (bVar2) {
    LogError<true,char[40]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf15,(char (*) [40])"Domain shader misses \"domain\" attribute");
  }
  std::operator<<(local_200,"layout(");
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)&local_218);
  bVar2 = std::operator==(&ppVar4->second,"tri");
  if (bVar2) {
    std::operator<<(local_200,"triangles");
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_218);
    bVar2 = std::operator==(&ppVar4->second,"quad");
    if (bVar2) {
      std::operator<<(local_200,"quads");
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)&local_218);
      bVar2 = std::operator==(&ppVar4->second,"isoline");
      if (bVar2) {
        std::operator<<(local_200,"isolines");
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                               *)&local_218);
        LogError<true,char[26],std::__cxx11::string,char[55]>
                  (false,"ProcessDomainShaderArguments",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xf1f,(char (*) [26])"Unexpected domain value \"",&ppVar4->second,
                   (char (*) [55])"\". String constant \"tri\", \"quad\" or \"isoline\" expected");
      }
    }
  }
  HashMapStringKey::HashMapStringKey(&local_248,"partitioning",false);
  local_238._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_78,&local_248);
  HashMapStringKey::~HashMapStringKey(&local_248);
  _msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_78);
  bVar2 = std::__detail::operator==
                    (&local_238,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      *)((long)&_msg.field_2 + 8));
  if (bVar2) {
    LogError<true,char[395]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf25,(char (*) [395])
                      "Undefined partitioning. In GLSL, partitioning is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\nPlease use the following comment right above the function declaration to define partitioning and output topology:\n/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */"
              );
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)&local_238);
  bVar2 = std::operator==(&ppVar4->second,"integer");
  if (bVar2) {
    std::operator<<(local_200,", equal_spacing");
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_238);
    bVar2 = std::operator==(&ppVar4->second,"fractional_even");
    if (bVar2) {
      std::operator<<(local_200,", fractional_even_spacing");
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)&local_238);
      bVar2 = std::operator==(&ppVar4->second,"fractional_odd");
      if (bVar2) {
        std::operator<<(local_200,", fractional_odd_spacing");
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                               *)&local_238);
        bVar2 = std::operator==(&ppVar4->second,"pow2");
        if (bVar2) {
          FormatString<char[73]>
                    ((string *)&TopologyIt,
                     (char (*) [73])
                     "pow2 partitioning is not supported by OpenGL. Using integer partitioning");
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar5 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(1,uVar5,0);
          }
          std::__cxx11::string::~string((string *)&TopologyIt);
          std::operator<<(local_200,", equal_spacing");
        }
        else {
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                 *)&local_238);
          LogError<true,char[26],std::__cxx11::string,char[86]>
                    (false,"ProcessDomainShaderArguments",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0xf33,(char (*) [26])"Unexpected partitioning \"",&ppVar4->second,
                     (char (*) [86])
                     "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected"
                    );
        }
      }
    }
  }
  HashMapStringKey::HashMapStringKey(&local_288,"outputtopology",false);
  local_278._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_78,&local_288);
  HashMapStringKey::~HashMapStringKey(&local_288);
  local_290._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_78);
  bVar2 = std::__detail::operator==(&local_278,&local_290);
  if (bVar2) {
    LogError<true,char[399]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf39,(char (*) [399])
                      "Undefined outputtopology. In GLSL, outputtopology is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\nPlease use the following comment right above the function declaration to define partitioning and output topology:\n/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */"
              );
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)&local_278);
  bVar2 = std::operator==(&ppVar4->second,"point");
  if (bVar2) {
    std::operator<<(local_200,"");
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_278);
    bVar2 = std::operator==(&ppVar4->second,"line");
    if (bVar2) {
      std::operator<<(local_200,"");
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)&local_278);
      bVar2 = std::operator==(&ppVar4->second,"triangle_cw");
      if (bVar2) {
        std::operator<<(local_200,", cw");
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                               *)&local_278);
        bVar2 = std::operator==(&ppVar4->second,"triangle_ccw");
        if (bVar2) {
          std::operator<<(local_200,", ccw");
        }
        else {
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                 *)&local_278);
          LogError<true,char[22],std::__cxx11::string,char[78]>
                    (false,"ProcessDomainShaderArguments",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0xf44,(char (*) [22])"Unexpected topology \"",&ppVar4->second,
                     (char (*) [78])
                     "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected"
                    );
        }
      }
    }
  }
  std::operator<<(local_200,")in;\n");
  std::__cxx11::stringstream::stringstream(local_418);
  std::__cxx11::stringstream::stringstream(local_5a0);
  std::__cxx11::stringstream::stringstream((stringstream *)&outLocation);
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  __end1 = std::
           vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ::begin(Params);
  TopLevelParam =
       (ShaderParameterInfo *)
       std::
       vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
       ::end(Params);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                                     *)&TopLevelParam), bVar2) {
    pSStack_750 = __gnu_cxx::
                  __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  ::operator*(&__end1);
    if (pSStack_750->storageQualifier == In) {
      local_751 = (pSStack_750->HSAttribs).PatchType == OutputPatch;
      if ((bool)local_751) {
        poVar6 = std::operator<<(local_408,"    const int _NumInputPoints = ");
        poVar6 = std::operator<<(poVar6,(string *)&pSStack_750->ArraySize);
        std::operator<<(poVar6,";\n");
        poVar6 = std::operator<<(local_408,"    ");
        poVar6 = std::operator<<(poVar6,(string *)&pSStack_750->Type);
        poVar6 = std::operator<<(poVar6,' ');
        poVar6 = std::operator<<(poVar6,(string *)&pSStack_750->Name);
        std::operator<<(poVar6,"[_NumInputPoints];\n");
        std::operator<<(local_408,"    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n");
      }
      pbStack_778 = &local_751;
      local_770 = (stringstream *)local_418;
      lStack_768 = (long)&__range1 + 4;
      local_760 = (stringstream *)local_5a0;
      ArgHandler_00.IsPatch = (bool *)pbStack_778;
      ArgHandler_00.this = this;
      ArgHandler_00.PrologueSS = local_770;
      ArgHandler_00.inLocation = (int *)lStack_768;
      ArgHandler_00.InterfaceVarsInSS = local_760;
      local_780 = this;
      ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments(std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>&,std::__cxx11::string&,std::__cxx11::stringstream&,std::__cxx11::string&)::__0>
                (this,pSStack_750,4,0,local_770,ArgHandler_00);
      if ((local_751 & 1) != 0) {
        std::operator<<(local_408,"    }\n");
      }
    }
    else if ((pSStack_750->storageQualifier == Out) || (pSStack_750->storageQualifier == Ret)) {
      ppvStack_798 = &__range1;
      local_790 = &outLocation;
      ArgHandler.outLocation = (int *)ppvStack_798;
      ArgHandler.this = this;
      ArgHandler.InterfaceVarsOutSS = (stringstream *)local_790;
      ArgHandler.ReturnHandlerSS = ReturnHandlerSS;
      local_7a0 = this;
      psStack_788 = ReturnHandlerSS;
      ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments(std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>&,std::__cxx11::string&,std::__cxx11::stringstream&,std::__cxx11::string&)::__1>
                (this,pSStack_750,4,1,(stringstream *)local_418,ArgHandler);
    }
    __gnu_cxx::
    __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)Prologue,local_7c0);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::str();
  std::operator+(&local_800,&local_820,&local_840);
  std::__cxx11::stringstream::str();
  std::operator+(&local_7e0,&local_800,&local_860);
  std::__cxx11::string::operator=((string *)Globals,(string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::stringstream::~stringstream((stringstream *)&outLocation);
  std::__cxx11::stringstream::~stringstream(local_5a0);
  std::__cxx11::stringstream::~stringstream(local_418);
  std::__cxx11::stringstream::~stringstream((stringstream *)&DomainIt);
  std::
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_78);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments(TokenListType::iterator&          TypeToken,
                                                                            std::vector<ShaderParameterInfo>& Params,
                                                                            String&                           Globals,
                                                                            std::stringstream&                ReturnHandlerSS,
                                                                            String&                           Prologue)
{
    auto Token = TypeToken;
    // [domain("quad")]
    // DSOut main( HS_CONSTANT_DATA_OUTPUT input,
    // ^

    std::unordered_map<HashMapStringKey, String> Attributes;
    ParseAttributesInComment(TypeToken->Delimiter, Attributes);
    ProcessShaderAttributes(Token, Attributes);

    stringstream GlobalsSS;
    auto         DomainIt = Attributes.find("domain");
    if (DomainIt == Attributes.end())
        LOG_ERROR_AND_THROW("Domain shader misses \"domain\" attribute");

    GlobalsSS << "layout(";
    if (DomainIt->second == "tri")
        GlobalsSS << "triangles";
    else if (DomainIt->second == "quad")
        GlobalsSS << "quads";
    else if (DomainIt->second == "isoline")
        GlobalsSS << "isolines";
    else
        LOG_ERROR_AND_THROW("Unexpected domain value \"", DomainIt->second, "\". String constant \"tri\", \"quad\" or \"isoline\" expected");

    auto PartitioningIt = Attributes.find("partitioning");
    if (PartitioningIt == Attributes.end())
        LOG_ERROR_AND_THROW("Undefined partitioning. In GLSL, partitioning is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\n"
                            "Please use the following comment right above the function declaration to define partitioning and output topology:\n"
                            "/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */");

    if (PartitioningIt->second == "integer")
        GlobalsSS << ", equal_spacing";
    else if (PartitioningIt->second == "fractional_even")
        GlobalsSS << ", fractional_even_spacing";
    else if (PartitioningIt->second == "fractional_odd")
        GlobalsSS << ", fractional_odd_spacing";
    else if (PartitioningIt->second == "pow2")
    {
        LOG_WARNING_MESSAGE("pow2 partitioning is not supported by OpenGL. Using integer partitioning");
        GlobalsSS << ", equal_spacing";
    }
    else
        LOG_ERROR_AND_THROW("Unexpected partitioning \"", PartitioningIt->second, "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected");

    auto TopologyIt = Attributes.find("outputtopology");
    if (TopologyIt == Attributes.end())
        LOG_ERROR_AND_THROW("Undefined outputtopology. In GLSL, outputtopology is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\n"
                            "Please use the following comment right above the function declaration to define partitioning and output topology:\n"
                            "/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */");

    if (TopologyIt->second == "point")
        GlobalsSS << "";
    else if (TopologyIt->second == "line")
        GlobalsSS << "";
    else if (TopologyIt->second == "triangle_cw")
        GlobalsSS << ", cw";
    else if (TopologyIt->second == "triangle_ccw")
        GlobalsSS << ", ccw";
    else
        LOG_ERROR_AND_THROW("Unexpected topology \"", TopologyIt->second, "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected");

    GlobalsSS << ")in;\n";

    std::stringstream PrologueSS, InterfaceVarsInSS, InterfaceVarsOutSS;
    int               inLocation = 0, outLocation = 0;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            bool IsPatch = TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::OutputPatch;
            if (IsPatch)
            {
                PrologueSS << "    const int _NumInputPoints = " << TopLevelParam.ArraySize << ";\n"; // gl_MaxPatchVertices
                PrologueSS << "    " << TopLevelParam.Type << ' ' << TopLevelParam.Name << "[_NumInputPoints];\n";
                // Iterate of the actual number of vertices in the input patch
                PrologueSS << "    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n";
            }

            ProcessShaderArgument(
                TopLevelParam, DSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    // All inputs from vertex shaders to the TCS are aggregated into arrays, based on the size of the input patch.
                    // The size of these arrays is the number of input patches provided by the patch primitive.
                    // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Inputs
                    String FullIndexedParamName = BuildParameterName(MemberStack, '.', "", "", IsPatch ? "[i]" : "");
                    if (IsPatch)
                        PrologueSS << "    ";
                    if (Getter.empty())
                    {
                        auto VarName      = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_dsin_" : "_");
                        auto InputVarName = VarName + (IsPatch ? "[i]" : "");
                        // User-defined inputs can be declared as unbounded arrays
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? inLocation++ : -1,
                                           GetInterpolationQualifier(Param), "in",
                                           Param.Type, VarName + (IsPatch ? "[]" : ""), InterfaceVarsInSS);
                        InitVariable(FullIndexedParamName, InputVarName, PrologueSS);
                    }
                    else
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                } //
            );

            if (IsPatch)
            {
                PrologueSS << "    }\n";
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, DSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_dsout_" : "_");
                        // Per-vertex outputs are aggregated into arrays.
                        // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? outLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName, InterfaceVarsOutSS);
                        // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                        // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                        ReturnHandlerSS << OutputVarName << " = " << SrcParamName << ";\\\n";
                    }
                    else
                        ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    Prologue = PrologueSS.str();
    Globals  = GlobalsSS.str() + InterfaceVarsInSS.str() + InterfaceVarsOutSS.str();
}